

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_history(parser *p)

{
  history_entry *phVar1;
  history_chart *phVar2;
  history_chart *phVar3;
  history_chart *phVar4;
  history_entry *phVar5;
  history_entry *phVar6;
  
  phVar4 = (history_chart *)parser_priv(p);
  histories = phVar4;
  do {
    if (phVar4 == (history_chart *)0x0) {
      parser_destroy(p);
      return 0;
    }
    if (phVar4->entries != (history_entry *)0x0) {
      phVar1 = phVar4->entries;
      phVar6 = (history_entry *)0x0;
      do {
        phVar5 = phVar1;
        phVar1 = phVar5->next;
        phVar5->next = phVar6;
        phVar6 = phVar5;
      } while (phVar1 != (history_entry *)0x0);
      phVar4->entries = phVar5;
      phVar3 = histories;
      do {
        phVar2 = phVar3;
        if (phVar5->isucc != L'\0') {
          while( true ) {
            if (phVar2 == (history_chart *)0x0) {
              phVar5->succ = (history_chart *)0x0;
              return -1;
            }
            if (phVar2->idx == phVar5->isucc) break;
            phVar2 = phVar2->next;
          }
          phVar5->succ = phVar2;
        }
        phVar5 = phVar5->next;
      } while (phVar5 != (history_entry *)0x0);
    }
    phVar4 = phVar4->next;
  } while( true );
}

Assistant:

static errr finish_parse_history(struct parser *p) {
	struct history_chart *c;
	struct history_entry *e, *prev, *next;
	histories = parser_priv(p);

	/* Go fix up the entry successor pointers. We can't compute them at
	 * load-time since we may not have seen the successor history yet. Also,
	 * we need to put the entries in the right order; the parser actually
	 * stores them backwards, which is not desirable.
	 */
	for (c = histories; c; c = c->next) {
		e = c->entries;
		prev = NULL;
		while (e) {
			next = e->next;
			e->next = prev;
			prev = e;
			e = next;
		}
		c->entries = prev;
		for (e = c->entries; e; e = e->next) {
			if (!e->isucc)
				continue;
			e->succ = findchart(histories, e->isucc);
			if (!e->succ) {
				return -1;
			}
		}
	}

	parser_destroy(p);
	return 0;
}